

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

wchar_t cmp_distance(void *a,void *b)

{
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  wchar_t ky;
  wchar_t kx;
  wchar_t db;
  wchar_t da;
  loc *pb;
  loc *pa;
  wchar_t px;
  wchar_t py;
  void *b_local;
  void *a_local;
  
  local_5c = (player->grid).y;
  local_58 = (player->grid).x;
  local_4c = *a - local_58;
  if (local_4c < 0) {
    local_4c = -local_4c;
  }
  local_50 = *(int *)((long)a + 4) - local_5c;
  if (local_50 < 0) {
    local_50 = -local_50;
  }
  if (local_50 < local_4c) {
    local_54 = local_4c * 2 + local_50;
  }
  else {
    local_54 = local_50 * 2 + local_4c;
  }
  local_58 = *b - local_58;
  if (local_58 < 0) {
    local_58 = -local_58;
  }
  local_5c = *(int *)((long)b + 4) - local_5c;
  if (local_5c < 0) {
    local_5c = -local_5c;
  }
  if (local_5c < local_58) {
    local_60 = local_58 * 2 + local_5c;
  }
  else {
    local_60 = local_5c * 2 + local_58;
  }
  if (local_54 < local_60) {
    a_local._4_4_ = L'\xffffffff';
  }
  else if (local_60 < local_54) {
    a_local._4_4_ = L'\x01';
  }
  else {
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

int cmp_distance(const void *a, const void *b)
{
	int py = player->grid.y;
	int px = player->grid.x;

	const struct loc *pa = a;
	const struct loc *pb = b;

	int da, db, kx, ky;

	/* Absolute distance components */
	kx = pa->x; kx -= px; kx = ABS(kx);
	ky = pa->y; ky -= py; ky = ABS(ky);

	/* Approximate Double Distance to the first point */
	da = ((kx > ky) ? (kx + kx + ky) : (ky + ky + kx));

	/* Absolute distance components */
	kx = pb->x; kx -= px; kx = ABS(kx);
	ky = pb->y; ky -= py; ky = ABS(ky);

	/* Approximate Double Distance to the first point */
	db = ((kx > ky) ? (kx + kx + ky) : (ky + ky + kx));

	/* Compare the distances */
	if (da < db)
		return -1;
	if (da > db)
		return 1;
	return 0;
}